

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::IsPathIncluded
               (CollectionMembershipQuery *query,Stage *stage,Path *abs_path,
               ExpansionRule expansionRule)

{
  bool bVar1;
  
  if (abs_path->_valid == true) {
    bVar1 = Path::is_root_path(abs_path);
    return bVar1;
  }
  return false;
}

Assistant:

bool IsPathIncluded(const CollectionMembershipQuery &query, const Stage &stage,
                    const Path &abs_path,
                    const CollectionInstance::ExpansionRule expansionRule) {
  (void)query;
  (void)stage;
  (void)expansionRule;

  DCOUT("TODO");

  if (!abs_path.is_valid()) {
    return false;
  }

  if (abs_path.is_root_path()) {
    return true;
  }

  return false;
}